

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_hashtable.hpp
# Opt level: O3

void __thiscall duckdb::AggregateHTScanState::AggregateHTScanState(AggregateHTScanState *this)

{
  vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
  *pvVar1;
  
  *(undefined1 (*) [16])
   ((long)&(this->scan_states).pin_state.heap_handles.handles.
           super_vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
           .
           super__Vector_base<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
           ._M_impl + 9) = (undefined1  [16])0x0;
  pvVar1 = &(this->scan_states).pin_state.heap_handles.handles.
            super_vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
  ;
  (pvVar1->
  super__Vector_base<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar1->
  super__Vector_base<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   ((long)&(this->scan_states).pin_state.row_handles.handles.
           super_vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
           .
           super__Vector_base<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
           ._M_impl + 8) = (undefined1  [16])0x0;
  this->partition_idx = 0;
  (this->scan_states).pin_state.row_handles.handles.
  super_vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
  .
  super__Vector_base<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  TupleDataChunkState::TupleDataChunkState(&(this->scan_states).chunk_state);
  *(undefined4 *)&(this->scan_states).segment_index = 0xffffffff;
  *(undefined4 *)((long)&(this->scan_states).segment_index + 4) = 0xffffffff;
  *(undefined4 *)&(this->scan_states).chunk_index = 0xffffffff;
  *(undefined4 *)((long)&(this->scan_states).chunk_index + 4) = 0xffffffff;
  return;
}

Assistant:

AggregateHTScanState() {
	}